

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertPileupFormatVisitor::Visit
          (ConvertPileupFormatVisitor *this,PileupPosition *pileupData)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  ostream *poVar5;
  size_type sVar6;
  char *pcVar7;
  int *in_RSI;
  long in_RDI;
  string TAB;
  char deletedBase;
  int i_1;
  char insertedBase;
  int i;
  char base;
  BamAlignment *ba;
  PileupAlignment pa;
  const_iterator pileupEnd;
  const_iterator pileupIter;
  stringstream mapQualities;
  stringstream baseQualities;
  stringstream bases;
  int numberAlleles;
  char referenceBase;
  int *position;
  string *referenceName;
  PileupAlignment *in_stack_fffffffffffff7d8;
  PileupAlignment *in_stack_fffffffffffff7e0;
  int *in_stack_fffffffffffff7e8;
  vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
  *in_stack_fffffffffffff7f0;
  char local_7a9;
  char local_789;
  char local_759;
  char local_738;
  char local_732;
  char local_719;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [39];
  allocator local_699;
  string local_698 [36];
  int local_674;
  int local_670;
  char local_669;
  int local_668;
  char local_661;
  int local_660;
  char local_659;
  BamAlignment *local_658;
  BamAlignment local_650;
  byte local_4f4;
  byte local_4f3;
  byte local_4f2;
  int local_4f0;
  int local_4ec;
  byte local_4e8;
  byte local_4e7;
  PileupAlignment *local_4e0;
  __normal_iterator<const_BamTools::PileupAlignment_*,_std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>_>
  local_4d8;
  stringstream local_4d0 [16];
  ostream aoStack_4c0 [392];
  stringstream local_338 [16];
  ostream local_328 [376];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  int local_28;
  char local_21;
  int *local_20;
  reference local_18;
  int *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>::empty
                    (in_stack_fffffffffffff7f0);
  if (!bVar1) {
    local_18 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                         ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                          (in_RDI + 0x20),(long)*local_10);
    local_20 = local_10 + 1;
    local_21 = 'N';
    if ((((*(byte *)(in_RDI + 0x10) & 1) == 0) ||
        (iVar2 = local_10[1],
        pvVar4 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                           ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                            (in_RDI + 0x20),(long)*local_10), pvVar4->RefLength <= iVar2)) ||
       (bVar1 = Fasta::GetBase((Fasta *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                               (int *)in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8),
       bVar1)) {
      sVar6 = std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>::
              size((vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_> *)
                   (local_10 + 2));
      local_28 = (int)sVar6;
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__cxx11::stringstream::stringstream(local_338);
      std::__cxx11::stringstream::stringstream(local_4d0);
      local_4d8._M_current =
           (PileupAlignment *)
           std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>::begin
                     (in_stack_fffffffffffff7d8);
      local_4e0 = (PileupAlignment *)
                  std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
                  ::end((vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>
                         *)in_stack_fffffffffffff7d8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_BamTools::PileupAlignment_*,_std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>_>
                                 *)in_stack_fffffffffffff7e0,
                                (__normal_iterator<const_BamTools::PileupAlignment_*,_std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>_>
                                 *)in_stack_fffffffffffff7d8), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_BamTools::PileupAlignment_*,_std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>_>
        ::operator*(&local_4d8);
        PileupAlignment::PileupAlignment(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        local_658 = &local_650;
        if ((local_4e8 & 1) != 0) {
          poVar5 = std::operator<<(local_1a0,'^');
          if (local_658->MapQuality < 0x5e) {
            local_719 = (char)local_658->MapQuality + '!';
          }
          else {
            local_719 = '~';
          }
          std::operator<<(poVar5,local_719);
        }
        if ((local_4f4 & 1) == 0) {
          pcVar7 = (char *)std::__cxx11::string::at((ulong)&local_658->QueryBases);
          local_659 = *pcVar7;
          if (local_659 == '=') {
LAB_0011fcea:
            bVar1 = BamAlignment::IsReverseStrand(local_658);
            local_732 = ',';
            if (!bVar1) {
              local_732 = '.';
            }
            local_659 = local_732;
          }
          else {
            iVar2 = toupper((int)local_659);
            iVar3 = toupper((int)local_21);
            if (iVar2 == iVar3) goto LAB_0011fcea;
            iVar2 = tolower((int)local_659);
            iVar3 = tolower((int)local_21);
            if (iVar2 == iVar3) goto LAB_0011fcea;
            bVar1 = BamAlignment::IsReverseStrand(local_658);
            if (bVar1) {
              iVar2 = tolower((int)local_659);
              local_738 = (char)iVar2;
            }
            else {
              iVar2 = toupper((int)local_659);
              local_738 = (char)iVar2;
            }
            local_659 = local_738;
          }
          std::operator<<(local_1a0,local_659);
          if ((local_4f2 & 1) == 0) {
            if ((local_4f3 & 1) != 0) {
              poVar5 = std::operator<<(local_1a0,'-');
              std::ostream::operator<<(poVar5,local_4f0);
              for (local_668 = 1; local_668 <= local_4f0; local_668 = local_668 + 1) {
                local_669 = 'N';
                if (((*(byte *)(in_RDI + 0x10) & 1) != 0) &&
                   (iVar2 = local_10[1] + local_668,
                   pvVar4 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::
                            operator[]((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                        *)(in_RDI + 0x20),(long)*local_10),
                   iVar2 < pvVar4->RefLength)) {
                  local_670 = local_10[1] + local_668;
                  bVar1 = Fasta::GetBase((Fasta *)in_stack_fffffffffffff7f0,
                                         in_stack_fffffffffffff7e8,(int *)in_stack_fffffffffffff7e0,
                                         (char *)in_stack_fffffffffffff7d8);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                             "bamtools convert ERROR: pileup conversion - could not read reference base from FASTA file"
                                            );
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    local_674 = 1;
                    goto LAB_001201c7;
                  }
                }
                bVar1 = BamAlignment::IsReverseStrand(local_658);
                if (bVar1) {
                  iVar2 = tolower((int)local_669);
                  local_789 = (char)iVar2;
                }
                else {
                  iVar2 = toupper((int)local_669);
                  local_789 = (char)iVar2;
                }
                std::operator<<(local_1a0,local_789);
              }
            }
          }
          else {
            poVar5 = std::operator<<(local_1a0,'+');
            std::ostream::operator<<(poVar5,local_4ec);
            for (local_660 = 1; local_660 <= local_4ec; local_660 = local_660 + 1) {
              pcVar7 = (char *)std::__cxx11::string::at((ulong)&local_658->QueryBases);
              local_661 = *pcVar7;
              bVar1 = BamAlignment::IsReverseStrand(local_658);
              if (bVar1) {
                iVar2 = tolower((int)local_661);
                local_759 = (char)iVar2;
              }
              else {
                iVar2 = toupper((int)local_661);
                local_759 = (char)iVar2;
              }
              std::operator<<(local_1a0,local_759);
            }
          }
        }
        else {
          std::operator<<(local_1a0,'*');
        }
        if ((local_4e7 & 1) != 0) {
          std::operator<<(local_1a0,'$');
        }
        pcVar7 = (char *)std::__cxx11::string::at((ulong)&local_658->Qualities);
        std::operator<<(local_328,*pcVar7);
        if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
          if (local_658->MapQuality < 0x5e) {
            local_7a9 = (char)local_658->MapQuality + '!';
          }
          else {
            local_7a9 = '~';
          }
          std::operator<<(aoStack_4c0,local_7a9);
        }
        local_674 = 0;
LAB_001201c7:
        PileupAlignment::~PileupAlignment((PileupAlignment *)0x1201d4);
        if (local_674 != 0) goto LAB_0012041c;
        __gnu_cxx::
        __normal_iterator<const_BamTools::PileupAlignment_*,_std::vector<BamTools::PileupAlignment,_std::allocator<BamTools::PileupAlignment>_>_>
        ::operator++(&local_4d8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_698,1,'\t',&local_699);
      std::allocator<char>::~allocator((allocator<char> *)&local_699);
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 0x18),(string *)local_18);
      poVar5 = std::operator<<(poVar5,local_698);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_20 + 1);
      poVar5 = std::operator<<(poVar5,local_698);
      poVar5 = std::operator<<(poVar5,local_21);
      poVar5 = std::operator<<(poVar5,local_698);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
      poVar5 = std::operator<<(poVar5,local_698);
      std::__cxx11::stringstream::str();
      poVar5 = std::operator<<(poVar5,local_6c0);
      poVar5 = std::operator<<(poVar5,local_698);
      std::__cxx11::stringstream::str();
      poVar5 = std::operator<<(poVar5,local_6e0);
      poVar5 = std::operator<<(poVar5,local_698);
      std::__cxx11::stringstream::str();
      poVar5 = std::operator<<(poVar5,local_700);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_700);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::string::~string(local_6c0);
      std::__cxx11::string::~string(local_698);
      local_674 = 0;
LAB_0012041c:
      std::__cxx11::stringstream::~stringstream(local_4d0);
      std::__cxx11::stringstream::~stringstream(local_338);
      std::__cxx11::stringstream::~stringstream(local_1b0);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "bamtools convert ERROR: pileup conversion - could not read reference base from FASTA file"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void ConvertPileupFormatVisitor::Visit(const PileupPosition& pileupData)
{

    // skip if no alignments at this position
    if (pileupData.PileupAlignments.empty()) {
        return;
    }

    // retrieve reference name
    const std::string& referenceName = m_references[pileupData.RefId].RefName;
    const int& position = pileupData.Position;

    // retrieve reference base from FASTA file, if one provided; otherwise default to 'N'
    char referenceBase('N');
    if (m_hasFasta && (pileupData.Position < m_references[pileupData.RefId].RefLength)) {
        if (!m_fasta.GetBase(pileupData.RefId, pileupData.Position, referenceBase)) {
            std::cerr << "bamtools convert ERROR: pileup conversion - could not read reference "
                         "base from FASTA file"
                      << std::endl;
            return;
        }
    }

    // get count of alleles at this position
    const int numberAlleles = pileupData.PileupAlignments.size();

    // -----------------------------------------------------------
    // build strings based on alleles at this positionInAlignment

    std::stringstream bases;
    std::stringstream baseQualities;
    std::stringstream mapQualities;

    // iterate over alignments at this pileup position
    std::vector<PileupAlignment>::const_iterator pileupIter = pileupData.PileupAlignments.begin();
    std::vector<PileupAlignment>::const_iterator pileupEnd = pileupData.PileupAlignments.end();
    for (; pileupIter != pileupEnd; ++pileupIter) {
        const PileupAlignment pa = (*pileupIter);
        const BamAlignment& ba = pa.Alignment;

        // if beginning of read segment
        if (pa.IsSegmentBegin) {
            bases << '^'
                  << (((int)ba.MapQuality > 93) ? (char)126 : (char)((int)ba.MapQuality + 33));
        }

        // if current base is not a DELETION
        if (!pa.IsCurrentDeletion) {

            // get base at current position
            char base = ba.QueryBases.at(pa.PositionInAlignment);

            // if base matches reference
            if (base == '=' || std::toupper(base) == std::toupper(referenceBase) ||
                std::tolower(base) == std::tolower(referenceBase)) {
                base = (ba.IsReverseStrand() ? ',' : '.');
            }

            // mismatches reference
            else {
                base = (ba.IsReverseStrand() ? std::tolower(base) : std::toupper(base));
            }

            // store base
            bases << base;

            // if next position contains insertion
            if (pa.IsNextInsertion) {
                bases << '+' << pa.InsertionLength;
                for (int i = 1; i <= pa.InsertionLength; ++i) {
                    char insertedBase = (char)ba.QueryBases.at(pa.PositionInAlignment + i);
                    bases << (ba.IsReverseStrand() ? (char)std::tolower(insertedBase)
                                                   : (char)std::toupper(insertedBase));
                }
            }

            // if next position contains DELETION
            else if (pa.IsNextDeletion) {
                bases << '-' << pa.DeletionLength;
                for (int i = 1; i <= pa.DeletionLength; ++i) {
                    char deletedBase('N');
                    if (m_hasFasta &&
                        (pileupData.Position + i < m_references[pileupData.RefId].RefLength)) {
                        if (!m_fasta.GetBase(pileupData.RefId, pileupData.Position + i,
                                             deletedBase)) {
                            std::cerr << "bamtools convert ERROR: pileup conversion - could not "
                                         "read reference base from FASTA file"
                                      << std::endl;
                            return;
                        }
                    }
                    bases << (ba.IsReverseStrand() ? (char)std::tolower(deletedBase)
                                                   : (char)std::toupper(deletedBase));
                }
            }
        }

        // otherwise, DELETION
        else {
            bases << '*';
        }

        // if end of read segment
        if (pa.IsSegmentEnd) {
            bases << '$';
        }

        // store current base quality
        baseQualities << ba.Qualities.at(pa.PositionInAlignment);

        // save alignment map quality if desired
        if (m_isPrintingMapQualities) {
            mapQualities << (((int)ba.MapQuality > 93) ? (char)126
                                                       : (char)((int)ba.MapQuality + 33));
        }
    }

    // ----------------------
    // print results

    // tab-delimited
    // <refName> <1-based pos> <refBase> <numberAlleles> <bases> <qualities> [mapQuals]

    const std::string TAB(1, '\t');
    *m_out << referenceName << TAB << position + 1 << TAB << referenceBase << TAB << numberAlleles
           << TAB << bases.str() << TAB << baseQualities.str() << TAB << mapQualities.str()
           << std::endl;
}